

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint channelsOut;
  ma_uint32 channelsIn;
  ma_attenuation_model mVar1;
  ma_handedness mVar2;
  ma_channel *pChannelMapOut;
  float *pfVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  double dVar10;
  int iVar15;
  undefined8 uVar11;
  float fVar9;
  undefined1 auVar12 [12];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar14 [16];
  undefined4 in_XMM1_Db;
  undefined4 uVar17;
  undefined4 in_XMM1_Dd;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar31 [16];
  float fVar32;
  ma_vec3f mVar33;
  ma_vec3f mVar34;
  ma_channel_mix_mode in_stack_fffffffffffffeb0;
  ma_mono_expansion_mode in_stack_fffffffffffffeb8;
  float local_138;
  float fStack_134;
  ma_vec3f local_128;
  float local_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  ma_channel *local_100;
  float local_f4;
  float local_f0;
  ma_uint32 local_ec;
  undefined8 local_e8;
  undefined4 uStack_e0;
  float fStack_dc;
  ma_vec3f local_d8;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  uVar17 = 0;
  if (pSpatializer == (ma_spatializer *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_100 = pSpatializer->pChannelMapIn;
  pChannelMapOut = (pListener->config).pChannelMapOut;
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    if ((pListener == (ma_spatializer_listener *)0x0) || (pListener->isEnabled == 0)) {
      if ((pFramesOut != (void *)0x0) &&
         (sVar7 = (pSpatializer->channelsOut << 2) * frameCount, sVar7 != 0)) {
        memset(pFramesOut,0,sVar7);
      }
    }
    else {
      channelsIn = pSpatializer->channelsIn;
      if (channelsIn == pSpatializer->channelsOut) {
        if (pFramesOut != pFramesIn) {
          memcpy(pFramesOut,pFramesIn,(channelsIn << 2) * frameCount);
        }
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,pChannelMapOut,pSpatializer->channelsOut,(float *)pFramesIn,
                   local_100,channelsIn,frameCount,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeb8);
      }
    }
    pSpatializer->dopplerPitch = 1.0;
  }
  else {
    uStack_c0 = local_c8;
    local_c8 = (undefined1  [8])pFramesIn;
    local_ec = pSpatializer->channelsIn;
    channelsOut = pSpatializer->channelsOut;
    uVar8 = (ulong)channelsOut;
    fVar19 = pSpatializer->minDistance;
    fVar18 = pSpatializer->maxDistance;
    _local_118 = ZEXT416((uint)pSpatializer->rolloff);
    local_68 = ZEXT416((uint)pSpatializer->dopplerFactor);
    if (pListener == (ma_spatializer_listener *)0x0) {
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      auVar12 = ZEXT812(0x43aba666);
    }
    else {
      mVar33 = ma_atomic_vec3f_get(&pListener->velocity);
      local_98 = mVar33._0_8_;
      local_88 = CONCAT44(in_XMM1_Db,mVar33.z);
      uStack_80 = CONCAT44(in_XMM1_Dd,uVar17);
      auVar12._4_8_ = 0;
      auVar12._0_4_ = (pListener->config).speedOfSound;
      uStack_90 = extraout_XMM0_Qb;
    }
    local_78._12_4_ = 0;
    local_78._0_12_ = auVar12;
    if ((pListener == (ma_spatializer_listener *)0x0) ||
       (pSpatializer->positioning == ma_positioning_relative)) {
      local_128 = ma_atomic_vec3f_get(&pSpatializer->position);
      local_d8 = ma_atomic_vec3f_get(&pSpatializer->direction);
    }
    else {
      ma_spatializer_get_relative_position_and_direction
                (pSpatializer,pListener,&local_128,&local_d8);
    }
    fVar9 = local_128.z * local_128.z + local_128.x * local_128.x + local_128.y * local_128.y;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    mVar1 = pSpatializer->attenuationModel;
    fVar32 = 1.0;
    if (mVar1 == ma_attenuation_model_exponential) {
      if (fVar19 < fVar18) {
        fVar32 = fVar9;
        if (fVar18 <= fVar9) {
          fVar32 = fVar18;
        }
        fVar18 = fVar19;
        if (fVar19 <= fVar32) {
          fVar18 = fVar32;
        }
        dVar10 = pow((double)(fVar18 / fVar19),(double)-(float)local_118._0_4_);
        fVar32 = (float)dVar10;
        fVar19 = fVar9;
      }
    }
    else if (mVar1 == ma_attenuation_model_linear) {
      if (fVar19 < fVar18) {
        fVar32 = fVar9;
        if (fVar18 <= fVar9) {
          fVar32 = fVar18;
        }
        fVar23 = fVar19;
        if (fVar19 <= fVar32) {
          fVar23 = fVar32;
        }
        fVar32 = 1.0 - ((fVar23 - fVar19) * (float)local_118._0_4_) / (fVar18 - fVar19);
      }
    }
    else if ((mVar1 == ma_attenuation_model_inverse) && (fVar19 < fVar18)) {
      fVar32 = fVar9;
      if (fVar18 <= fVar9) {
        fVar32 = fVar18;
      }
      fVar18 = fVar19;
      if (fVar19 <= fVar32) {
        fVar18 = fVar32;
      }
      fVar32 = fVar19 / ((float)local_118._0_4_ * (fVar18 - fVar19) + fVar19);
    }
    mVar33 = local_d8;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    auVar20 = ZEXT812(0);
    fVar18 = 0.0;
    if (0.001 < fVar9) {
      fVar18 = 1.0 / fVar9;
      fVar23 = fVar18 * local_128.x;
      fVar24 = fVar18 * local_128.y;
      fVar25 = fVar18 * 0.0;
      fVar26 = fVar18 * 0.0;
      auVar20._4_8_ = 0;
      auVar20._0_4_ = fVar18 * local_128.z;
      fVar18 = fVar9;
    }
    auVar22._12_4_ = 0;
    auVar22._0_12_ = auVar20;
    local_118._0_4_ = fVar18;
    local_e8 = pListener;
    if (0.0 < fVar18) {
      local_58 = fVar23;
      fStack_54 = fVar24;
      fStack_50 = fVar25;
      fStack_4c = fVar26;
      local_48 = auVar22;
      fVar18 = 1.0;
      if (pSpatializer->coneInnerAngleInRadians < 6.283185) {
        local_b8 = -fVar23;
        fStack_b4 = -fVar24;
        fStack_b0 = -fVar25;
        fStack_ac = -fVar26;
        local_a8._0_4_ = local_d8.x;
        local_a8._4_4_ = local_d8.y;
        local_a8._8_8_ = 0;
        local_d8.z = mVar33.z;
        fVar9 = local_d8.z * auVar20._0_4_;
        local_11c = pSpatializer->coneOuterGain;
        local_f4 = pSpatializer->coneOuterAngleInRadians;
        local_d8 = mVar33;
        dVar10 = sin(1.5707963267948966 - (double)(pSpatializer->coneInnerAngleInRadians * 0.5));
        local_f0 = (float)dVar10;
        dVar10 = sin(1.5707963267948966 - (double)(local_f4 * 0.5));
        fVar9 = (local_b8 * (float)local_a8._0_4_ - (float)local_a8._4_4_ * fVar24) - fVar9;
        fVar19 = fVar32;
        fVar18 = 1.0;
        if ((fVar9 <= local_f0) && (fVar23 = (float)dVar10, fVar18 = local_11c, fVar23 < fVar9)) {
          fVar18 = (fVar9 - fVar23) / (local_f0 - fVar23);
          fVar18 = local_11c * (1.0 - fVar18) + fVar18;
        }
      }
      fVar32 = fVar32 * fVar18;
      if ((pListener != (ma_spatializer_listener *)0x0) &&
         (fVar18 = (pListener->config).coneInnerAngleInRadians, fVar18 < 6.283185)) {
        mVar2 = (pListener->config).handedness;
        fVar9 = (pListener->config).coneOuterGain;
        local_b8 = (pListener->config).coneOuterAngleInRadians * 0.5;
        fVar19 = fVar32;
        dVar10 = sin(1.5707963267948966 - (double)(fVar18 * 0.5));
        local_a8._0_4_ = (float)dVar10;
        dVar10 = sin(1.5707963267948966 - (double)local_b8);
        fVar18 = (float)local_48._0_4_ *
                 *(float *)(&DAT_0017c580 + (ulong)(mVar2 == ma_handedness_right) * 4) +
                 local_58 * 0.0 + fVar24 * 0.0;
        if (fVar18 <= (float)local_a8._0_4_) {
          fVar32 = (float)dVar10;
          if (fVar32 < fVar18) {
            fVar18 = (fVar18 - fVar32) / ((float)local_a8._0_4_ - fVar32);
            fVar9 = fVar9 * (1.0 - fVar18) + fVar18;
          }
        }
        else {
          fVar9 = 1.0;
        }
        fVar32 = fVar19 * fVar9;
        pListener = local_e8;
      }
    }
    auVar14 = _DAT_001810c0;
    auVar22 = _DAT_0017ad70;
    fVar18 = fVar32;
    if (pSpatializer->maxGain <= fVar32) {
      fVar18 = pSpatializer->maxGain;
    }
    lVar5 = 0x1c;
    if ((fVar18 < pSpatializer->minGain) || (lVar5 = 0x20, pSpatializer->maxGain <= fVar32)) {
      fVar32 = *(float *)((long)&pSpatializer->channelsIn + lVar5);
    }
    if (uVar8 != 0) {
      pfVar3 = pSpatializer->pNewChannelGainsOut;
      lVar5 = uVar8 - 1;
      auVar13._8_4_ = (int)lVar5;
      auVar13._0_8_ = lVar5;
      auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar13 = auVar13 ^ _DAT_0017ad70;
      auVar16 = _DAT_0017ad90;
      auVar21 = _DAT_0017ad60;
      do {
        auVar29 = auVar21 ^ auVar22;
        iVar15 = auVar13._4_4_;
        if ((bool)(~(auVar29._4_4_ == iVar15 && auVar13._0_4_ < auVar29._0_4_ ||
                    iVar15 < auVar29._4_4_) & 1)) {
          *(float *)((long)pfVar3 + uVar6) = fVar32;
        }
        if ((auVar29._12_4_ != auVar13._12_4_ || auVar29._8_4_ <= auVar13._8_4_) &&
            auVar29._12_4_ <= auVar13._12_4_) {
          *(float *)((long)pfVar3 + uVar6 + 4) = fVar32;
        }
        auVar29 = auVar16 ^ auVar22;
        iVar30 = auVar29._4_4_;
        if (iVar30 <= iVar15 && (iVar30 != iVar15 || auVar29._0_4_ <= auVar13._0_4_)) {
          *(float *)((long)pfVar3 + uVar6 + 8) = fVar32;
          *(float *)((long)pfVar3 + uVar6 + 0xc) = fVar32;
        }
        lVar5 = auVar21._8_8_;
        lVar27 = auVar14._0_8_;
        auVar21._0_8_ = auVar21._0_8_ + lVar27;
        lVar28 = auVar14._8_8_;
        auVar21._8_8_ = lVar5 + lVar28;
        lVar5 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + lVar27;
        auVar16._8_8_ = lVar5 + lVar28;
        uVar6 = uVar6 + 0x10;
      } while ((uVar8 * 4 + 0xc & 0xfffffffffffffff0) != uVar6);
    }
    if ((pListener == (ma_spatializer_listener *)0x0) || (pListener->isEnabled == 0)) {
      if ((pFramesOut != (void *)0x0) &&
         (sVar7 = (pSpatializer->channelsOut << 2) * frameCount, sVar7 != 0)) {
        memset(pFramesOut,0,sVar7);
      }
    }
    else {
      ma_channel_map_apply_f32
                ((float *)pFramesOut,pChannelMapOut,channelsOut,(float *)local_c8,local_100,local_ec
                 ,frameCount,in_stack_fffffffffffffeb0,(ma_mono_expansion_mode)fVar19);
    }
    fVar18 = 0.0;
    fVar19 = 0.0;
    if ((0.0 < (float)local_118._0_4_) && (uVar8 != 0)) {
      fVar19 = 1.0 / (float)local_118._0_4_;
      local_100 = (ma_channel *)CONCAT44(local_100._4_4_,fVar19 * local_128.x);
      fVar18 = local_128.y;
      local_118._4_4_ = fVar18;
      local_118._0_4_ = fVar18 * fVar19;
      fStack_110 = fVar18;
      fStack_10c = fVar18;
      local_c8._0_4_ = fVar19 * local_128.z;
      uVar6 = 0;
      fVar19 = fVar18;
      do {
        if (pChannelMapOut == (ma_channel *)0x0) {
          bVar4 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar6);
        }
        else {
          bVar4 = pChannelMapOut[uVar6];
        }
        fVar9 = 1.0;
        if (((5 < bVar4) || ((0x23U >> (bVar4 & 0x1f) & 1) == 0)) && (0x1f < (byte)(bVar4 - 0x14)))
        {
          lVar5 = 0;
          do {
            fVar32 = *(float *)((long)g_maChannelPlaneRatios[0] +
                               (ulong)((uint)bVar4 * 8) * 3 + lVar5 * 4);
            if ((fVar32 != 0.0) || (NAN(fVar32))) {
              uVar11 = 0;
              fVar9 = -1.0;
              if (bVar4 < 0x34) {
                uVar11._0_4_ = g_maChannelDirections[bVar4].x;
                uVar11._4_4_ = g_maChannelDirections[bVar4].y;
                fVar9 = g_maChannelDirections[bVar4].z;
              }
              fVar19 = 0.0;
              fVar18 = 0.0;
              fVar9 = (((float)((ulong)uVar11 >> 0x20) * (float)local_118._0_4_ +
                        local_100._0_4_ * (float)uVar11 + fVar9 * (float)local_c8._0_4_ + -1.0) *
                       pSpatializer->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
              break;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 6);
        }
        if (fVar9 <= pSpatializer->minSpatializationChannelGain) {
          fVar9 = pSpatializer->minSpatializationChannelGain;
        }
        pSpatializer->pNewChannelGainsOut[uVar6] = fVar9 * pSpatializer->pNewChannelGainsOut[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar8);
    }
    ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
    ma_gainer_process_pcm_frames(&pSpatializer->gainer,pFramesOut,pFramesOut,frameCount);
    fVar9 = 1.0;
    if (0.0 < (float)local_68._0_4_) {
      if (local_e8 == (ma_spatializer_listener *)0x0) {
        mVar33 = (ma_vec3f)ZEXT812(0);
      }
      else {
        mVar33 = ma_atomic_vec3f_get(&local_e8->position);
      }
      mVar34 = ma_atomic_vec3f_get(&pSpatializer->position);
      local_138 = mVar33.x;
      fStack_134 = mVar33.y;
      local_138 = local_138 - mVar34.x;
      local_118._4_4_ = fStack_134 - mVar34.y;
      local_118._0_4_ = local_118._4_4_;
      fStack_110 = (float)local_118._4_4_;
      fStack_10c = (float)local_118._4_4_;
      fVar32 = mVar33.z - mVar34.z;
      mVar33 = ma_atomic_vec3f_get(&pSpatializer->velocity);
      local_e8._0_4_ = mVar33.z;
      local_c8._0_4_ = mVar33.x;
      local_c8._4_4_ = mVar33.y;
      fVar23 = fVar32 * fVar32 +
               local_138 * local_138 + (float)local_118._0_4_ * (float)local_118._0_4_;
      local_e8._4_4_ = fVar18;
      if (fVar23 < 0.0) {
        uStack_e0 = 0;
        unique0x1000019c = (int)extraout_XMM0_Qb_00;
        local_c8 = (undefined1  [8])mVar33._0_8_;
        unique0x100001a0 = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        fStack_dc = fVar19;
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar9 = 1.0;
      if ((fVar23 != 0.0) || (NAN(fVar23))) {
        auVar31._0_4_ = (float)local_78._0_4_ / (float)local_68._0_4_;
        auVar29._0_4_ =
             (float)local_88 * fVar32 +
             (float)local_98 * local_138 + local_98._4_4_ * (float)local_118._0_4_;
        auVar29._4_4_ =
             (float)local_e8 * fVar32 +
             (float)local_c8._0_4_ * local_138 + (float)local_c8._4_4_ * (float)local_118._4_4_;
        auVar29._8_4_ =
             local_88._4_4_ * fVar32 + local_98._4_4_ * local_138 + (float)uStack_90 * fStack_110;
        auVar29._12_4_ =
             local_e8._4_4_ * fVar32 +
             (float)local_c8._4_4_ * local_138 + uStack_90._4_4_ * fStack_10c;
        auVar14._4_4_ = fVar23;
        auVar14._0_4_ = fVar23;
        auVar14._8_4_ = fVar23;
        auVar14._12_4_ = fVar23;
        auVar22 = divps(auVar29,auVar14);
        auVar31._4_4_ = auVar31._0_4_;
        auVar31._8_4_ = auVar31._0_4_;
        auVar31._12_4_ = auVar31._0_4_;
        auVar22 = minps(auVar22,auVar31);
        fVar9 = ((float)local_78._0_4_ - (float)local_68._0_4_ * auVar22._0_4_) /
                ((float)local_78._0_4_ - (float)local_68._0_4_ * auVar22._4_4_);
      }
    }
    pSpatializer->dopplerPitch = fVar9;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (ma_atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The velocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = ma_spatializer_listener_get_velocity(pListener);
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = ma_spatializer_get_position(pSpatializer);
            relativeDir = ma_spatializer_get_direction(pSpatializer);
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source angular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        The gain needs to be applied per-channel here. The spatialization code below will be changing the per-channel
        gains which will then eventually be passed into the gainer which will deal with smoothing the gain transitions
        to avoid harsh changes in gain.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }


        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = pSpatializer->minSpatializationChannelGain;

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(ma_spatializer_listener_get_position(pListener), ma_spatializer_get_position(pSpatializer)), ma_spatializer_get_velocity(pSpatializer), listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}